

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

reference __thiscall
QVLABase<QDirSortItem>::emplace_back_impl<QFileInfo_const&,QFlags<QDir::SortFlag>&>
          (QVLABase<QDirSortItem> *this,qsizetype prealloc,void *array,QFileInfo *args,
          QFlags<QDir::SortFlag> *args_1)

{
  qsizetype *pqVar1;
  long lVar2;
  QDirSortItem *pQVar3;
  
  lVar2 = (this->super_QVLABaseBase).s;
  if (lVar2 == (this->super_QVLABaseBase).a) {
    growBy(this,prealloc,array,1);
    lVar2 = (this->super_QVLABaseBase).s;
  }
  pQVar3 = q20::construct_at<QDirSortItem,QFileInfo_const&,QFlags<QDir::SortFlag>&,void>
                     ((QDirSortItem *)(lVar2 * 0x38 + (long)(this->super_QVLABaseBase).ptr),args,
                      args_1);
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return pQVar3;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }